

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCore.c
# Opt level: O1

int If_ManPerformMappingComb(If_Man_t *p)

{
  void **ppvVar1;
  float *pfVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  If_Par_t *pIVar6;
  long lVar7;
  int level;
  long lVar8;
  float fVar9;
  timespec ts;
  timespec local_30;
  
  iVar4 = clock_gettime(3,&local_30);
  if (iVar4 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  lVar5 = (long)p->vCis->nSize;
  if (0 < lVar5) {
    ppvVar1 = p->vCis->pArray;
    pfVar2 = p->pPars->pTimesArr;
    lVar7 = 0;
    do {
      if (pfVar2 == (float *)0x0) {
        fVar9 = 0.0;
      }
      else {
        fVar9 = pfVar2[lVar7];
      }
      pvVar3 = ppvVar1[lVar7];
      *(float *)((long)pvVar3 + 0x5c) = fVar9;
      *(undefined4 *)((long)pvVar3 + 0x30) = 0x3f800000;
      lVar7 = lVar7 + 1;
    } while (lVar5 != lVar7);
  }
  pIVar6 = p->pPars;
  if ((pIVar6->fPreprocess == 0) || (pIVar6->fArea != 0)) {
    If_ManPerformMappingRound(p,pIVar6->nCutsMax,0,0,1,"Delay");
  }
  else {
    If_ManPerformMappingRound(p,pIVar6->nCutsMax,0,1,1,"Delay");
    p->pPars->fFancy = 1;
    If_ManResetOriginalRefs(p);
    If_ManPerformMappingRound(p,p->pPars->nCutsMax,0,1,0,"Delay-2");
    pIVar6 = p->pPars;
    pIVar6->fArea = 1;
    pIVar6->fFancy = 0;
    If_ManResetOriginalRefs(p);
    If_ManPerformMappingRound(p,p->pPars->nCutsMax,0,1,0,"Area");
    p->pPars->fArea = 0;
  }
  if (p->pPars->fExpRed != 0) {
    If_ManImproveMapping(p);
  }
  pIVar6 = p->pPars;
  if (0 < pIVar6->nFlowIters) {
    iVar4 = 0;
    do {
      If_ManPerformMappingRound(p,pIVar6->nCutsMax,1,0,0,"Flow");
      if (p->pPars->fExpRed != 0) {
        If_ManImproveMapping(p);
      }
      iVar4 = iVar4 + 1;
      pIVar6 = p->pPars;
    } while (iVar4 < pIVar6->nFlowIters);
  }
  pIVar6 = p->pPars;
  if (0 < pIVar6->nAreaIters) {
    iVar4 = 0;
    do {
      If_ManPerformMappingRound(p,pIVar6->nCutsMax,2,0,0,"Area");
      if (p->pPars->fExpRed != 0) {
        If_ManImproveMapping(p);
      }
      iVar4 = iVar4 + 1;
      pIVar6 = p->pPars;
    } while (iVar4 < pIVar6->nAreaIters);
  }
  if (pIVar6->fVerbose != 0) {
    level = 3;
    iVar4 = clock_gettime(3,&local_30);
    if (iVar4 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Total time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar5 - lVar8) / 1000000.0);
  }
  iVar4 = clock_gettime(3,&local_30);
  if (iVar4 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  s_MappingTime = lVar5 - lVar8;
  pIVar6 = p->pPars;
  pIVar6->FinalDelay = p->RequiredGlo;
  pIVar6->FinalArea = p->AreaGlo;
  return 1;
}

Assistant:

int If_ManPerformMappingComb( If_Man_t * p )
{
    If_Obj_t * pObj;
    abctime clkTotal = Abc_Clock();
    int i;

    // set arrival times and fanout estimates
    If_ManForEachCi( p, pObj, i )
    {
        If_ObjSetArrTime( pObj, p->pPars->pTimesArr ? p->pPars->pTimesArr[i] : (float)0.0 );
        pObj->EstRefs = (float)1.0;
    }

    // delay oriented mapping
    if ( p->pPars->fPreprocess && !p->pPars->fArea )
    {
        // map for delay
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 0, 1, 1, "Delay" );
        // map for delay second option
        p->pPars->fFancy = 1;
        If_ManResetOriginalRefs( p );
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 0, 1, 0, "Delay-2" );
        p->pPars->fFancy = 0;
        // map for area
        p->pPars->fArea = 1;
        If_ManResetOriginalRefs( p );
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 0, 1, 0, "Area" );
        p->pPars->fArea = 0;
    }
    else
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 0, 0, 1, "Delay" );

    // try to improve area by expanding and reducing the cuts
    if ( p->pPars->fExpRed )
        If_ManImproveMapping( p );

    // area flow oriented mapping
    for ( i = 0; i < p->pPars->nFlowIters; i++ )
    {
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 1, 0, 0, "Flow" );
        if ( p->pPars->fExpRed )
            If_ManImproveMapping( p );
    }

    // area oriented mapping
    for ( i = 0; i < p->pPars->nAreaIters; i++ )
    {
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 2, 0, 0, "Area" );
        if ( p->pPars->fExpRed )
            If_ManImproveMapping( p );
    }

    if ( p->pPars->fVerbose )
    {
//        Abc_Print( 1, "Total memory = %7.2f MB. Peak cut memory = %7.2f MB.  ", 
//            1.0 * (p->nObjBytes + 2*sizeof(void *)) * If_ManObjNum(p) / (1<<20), 
//            1.0 * p->nSetBytes * Mem_FixedReadMaxEntriesUsed(p->pMemSet) / (1<<20) );
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clkTotal );
    }
//    Abc_Print( 1, "Cross cut memory = %d.\n", Mem_FixedReadMaxEntriesUsed(p->pMemSet) );
    s_MappingTime = Abc_Clock() - clkTotal;
//    Abc_Print( 1, "Special POs = %d.\n", If_ManCountSpecialPos(p) );

/*
    {
        static char * pLastName = NULL;
        FILE * pTable = fopen( "fpga/ucsb/stats.txt", "a+" );
        if ( pLastName == NULL || strcmp(pLastName, p->pName) )
        {
            fprintf( pTable, "\n" );
            fprintf( pTable, "%s ", p->pName );

            fprintf( pTable, "%d ", If_ManCiNum(p) );
            fprintf( pTable, "%d ", If_ManCoNum(p) );
            fprintf( pTable, "%d ", If_ManAndNum(p) );

            ABC_FREE( pLastName );
            pLastName = Abc_UtilStrsav( p->pName );
        }

        fprintf( pTable, "%d ", (int)p->AreaGlo );
        fprintf( pTable, "%d ", (int)p->RequiredGlo );
        fclose( pTable );
    }
*/
    p->pPars->FinalDelay = p->RequiredGlo;
    p->pPars->FinalArea  = p->AreaGlo;
    return 1;
}